

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

void __thiscall FTagManager::RemoveSectorTags(FTagManager *this,int sect)

{
  FTagItem *pFVar1;
  long lVar2;
  FTagItem *pFVar3;
  
  if ((((uint)sect < (this->startForSector).Count) &&
      (lVar2 = (long)(this->startForSector).Array[sect], -1 < lVar2)) &&
     (pFVar3 = (this->allTags).Array, pFVar3[lVar2].target == sect)) {
    pFVar3 = pFVar3 + lVar2;
    do {
      pFVar3->target = -1;
      pFVar3->tag = -1;
      pFVar1 = pFVar3 + 1;
      pFVar3 = pFVar3 + 1;
    } while (pFVar1->target == sect);
  }
  return;
}

Assistant:

void FTagManager::RemoveSectorTags(int sect)
{
	if (startForSector.Size() > (unsigned int)sect)
	{
		int start = startForSector[sect];
		if (start >= 0)
		{
			while (allTags[start].target == sect)
			{
				allTags[start].tag = allTags[start].target = -1;
				start++;
			}
		}
	}
}